

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

float32 likelhddec(float32 *meana,float32 *vara,float32 *meanb,float32 *varb,float32 **cnta,
                  float32 **cntb,int32 ndensity,int32 nfeat,int32 dim,int32 continuous)

{
  cmd_ln_t *cmdln;
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double local_e0;
  double local_c8;
  double local_b0;
  double local_a0;
  double local_88;
  double local_70;
  float local_68;
  float local_64;
  float32 Q;
  float32 P;
  int32 j;
  float32 minvar;
  float32 lkdec;
  float32 nv;
  float32 nm;
  float32 lc;
  float32 lb;
  float32 la;
  float32 cntc;
  int32 i;
  float32 **cntb_local;
  float32 **cnta_local;
  float32 *varb_local;
  float32 *meanb_local;
  float32 *vara_local;
  float32 *meana_local;
  
  if (continuous == 0) {
    j = 0;
    for (la = 0.0; (int)la < nfeat; la = (float32)((int)la + 1)) {
      local_64 = 0.0;
      local_68 = 0.0;
      for (Q = 0.0; (int)Q < ndensity; Q = (float32)((int)Q + 1)) {
        local_64 = (float)cnta[(int)la][(int)Q] + local_64;
        local_68 = (float)cntb[(int)la][(int)Q] + local_68;
        if (((float)cnta[(int)la][(int)Q] != 0.0) || (NAN((float)cnta[(int)la][(int)Q]))) {
          fVar1 = (float)cnta[(int)la][(int)Q];
          local_70 = log((double)(float)cnta[(int)la][(int)Q]);
          local_70 = (double)fVar1 * local_70;
        }
        else {
          local_70 = 0.0;
        }
        if (((float)cntb[(int)la][(int)Q] != 0.0) || (NAN((float)cntb[(int)la][(int)Q]))) {
          fVar1 = (float)cntb[(int)la][(int)Q];
          local_88 = log((double)(float)cntb[(int)la][(int)Q]);
          local_88 = (double)fVar1 * local_88;
        }
        else {
          local_88 = 0.0;
        }
        if (((float)cnta[(int)la][(int)Q] + (float)cntb[(int)la][(int)Q] != 0.0) ||
           (NAN((float)cnta[(int)la][(int)Q] + (float)cntb[(int)la][(int)Q]))) {
          fVar1 = (float)cnta[(int)la][(int)Q];
          fVar2 = (float)cntb[(int)la][(int)Q];
          local_a0 = log((double)((float)cnta[(int)la][(int)Q] + (float)cntb[(int)la][(int)Q]));
          local_a0 = (double)(fVar1 + fVar2) * local_a0;
        }
        else {
          local_a0 = 0.0;
        }
        j = (int32)(float)((double)(float)j + ((local_70 + local_88) - local_a0));
      }
      if ((local_64 != 0.0) || (NAN(local_64))) {
        local_b0 = log((double)local_64);
        local_b0 = (double)local_64 * local_b0;
      }
      else {
        local_b0 = 0.0;
      }
      if ((local_68 != 0.0) || (NAN(local_68))) {
        local_c8 = log((double)local_68);
        local_c8 = (double)local_68 * local_c8;
      }
      else {
        local_c8 = 0.0;
      }
      if ((local_64 + local_68 != 0.0) || (NAN(local_64 + local_68))) {
        local_e0 = log((double)(local_64 + local_68));
        local_e0 = (double)(local_64 + local_68) * local_e0;
      }
      else {
        local_e0 = 0.0;
      }
      j = (int32)(float)((double)(float)j - ((local_b0 + local_c8) - local_e0));
    }
  }
  else {
    cmdln = cmd_ln_get();
    dVar3 = cmd_ln_float_r(cmdln,"-varfloor");
    fVar1 = (float)**cnta + (float)**cntb;
    nv = 0.0;
    nm = 0.0;
    lc = 0.0;
    for (la = 0.0; (int)la < dim; la = (float32)((int)la + 1)) {
      fVar2 = ((float)**cnta * (float)meana[(int)la] + (float)**cntb * (float)meanb[(int)la]) /
              fVar1;
      minvar = (float32)(-fVar2 * fVar2 +
                        ((float)**cnta *
                         ((float)meana[(int)la] * (float)meana[(int)la] + (float)vara[(int)la]) +
                        (float)**cntb *
                        ((float)meanb[(int)la] * (float)meanb[(int)la] + (float)varb[(int)la])) /
                        fVar1);
      if ((float)minvar < (float)dVar3) {
        minvar = (float32)(float)dVar3;
      }
      dVar4 = log((double)(float)minvar);
      nv = (float32)((float)dVar4 + (float)nv);
      dVar4 = log((double)(float)varb[(int)la]);
      nm = (float32)((float)dVar4 + (float)nm);
      dVar4 = log((double)(float)vara[(int)la]);
      lc = (float32)((float)dVar4 + (float)lc);
    }
    j = (int32)((-(float)**cnta * (float)lc + fVar1 * (float)nv + -((float)**cntb * (float)nm)) *
               0.5);
  }
  return (float32)j;
}

Assistant:

float32    likelhddec(float32 *meana, float32 *vara,
                      float32 *meanb, float32 *varb,
                      float32 **cnta, float32 **cntb,
                      int32 ndensity, int32 nfeat, int32 dim, int32 continuous)
{
    int32   i;
    float32 cntc, la, lb, lc, nm, nv, lkdec, minvar;

    if (continuous) {
        minvar = cmd_ln_float32("-varfloor");
        cntc = cnta[0][0] + cntb[0][0];

        for (i=0, lc=0, lb=0, la=0;i<dim;i++){
            nm = (cnta[0][0]*meana[i] + cntb[0][0]*meanb[i])/cntc;
            nv = cnta[0][0]*(vara[i]+meana[i]*meana[i])+
                 cntb[0][0]*(varb[i]+meanb[i]*meanb[i]);
            nv = nv/cntc - nm*nm;
            if (nv < minvar) nv = minvar;
            lc += (float32)log(nv);
            lb += (float32)log(varb[i]);
            la += (float32)log(vara[i]);
        }
        lkdec = 0.5*(cntc*lc - cntb[0][0]*lb - cnta[0][0]*la);
    }
    else {
        int32 j;
        float32 P,Q;
        for (i=0,lkdec = 0; i < nfeat; i++) {
            for (j=0,P=0,Q=0; j < ndensity; j++) {
                P += cnta[i][j]; Q += cntb[i][j];
                lkdec += ((cnta[i][j]==0) ? 0 : cnta[i][j]*log(cnta[i][j]))
		       + ((cntb[i][j]==0) ? 0 : cntb[i][j]*log(cntb[i][j]))
		       - (((cnta[i][j]+cntb[i][j])==0) ? 0 : 
			  (cnta[i][j]+cntb[i][j])*log(cnta[i][j]+cntb[i][j]));
            }
            lkdec -= 
		((P==0) ? 0 : (P*log(P))) +
		((Q==0) ? 0 : (Q*log(Q))) -
		(((P+Q)==0) ? 0 : ((P+Q)*log(P+Q)));
        }
#if 0
        /* The old code, assumed log(0) would give a reasonable answer */
	for (i=0,lkdec = 0; i < nfeat; i++) {
            for (j=0,P=0,Q=0; j < ndensity; j++) {
                P += cnta[i][j]; Q += cntb[i][j];
                lkdec += cnta[i][j]*log(cnta[i][j]) + cntb[i][j]*log(cntb[i][j])
                           -(cnta[i][j]+cntb[i][j])*log(cnta[i][j]+cntb[i][j]);
            }
            lkdec -= P*log(P) + Q*log(Q) - (P+Q)*log(P+Q);
        }
#endif 
    }

    return(lkdec);
}